

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O0

SHMPTR SHMGetInfo(SHM_INFO_ID element)

{
  void *pvVar1;
  void *pvVar2;
  SHMPTR retval;
  SHM_FIRST_HEADER *header;
  unsigned_long uStack_10;
  SHM_INFO_ID element_local;
  
  if ((int)element < 3) {
    pvVar1 = (void *)pthread_self();
    pvVar2 = Volatile::operator_cast_to_void_((Volatile *)&locking_thread);
    if (pvVar1 != pvVar2) {
      fprintf(_stderr,"] %s %s:%d","SHMGetInfo",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
              ,0x392);
      fprintf(_stderr,"SHMGetInfo called while thread does not hold the SHM lock!\n");
    }
    pvVar1 = Volatile<void_*>::Load(shm_segment_bases);
    uStack_10 = Volatile::operator_cast_to_unsigned_long
                          ((Volatile *)((long)pvVar1 + (ulong)element * 8 + 0xa8));
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","SHMGetInfo",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
            ,0x38a);
    fprintf(_stderr,"Invalid SHM info element %d\n",(ulong)element);
    uStack_10 = 0;
  }
  return uStack_10;
}

Assistant:

SHMPTR SHMGetInfo(SHM_INFO_ID element)
{
    SHM_FIRST_HEADER *header = NULL;
    SHMPTR retval = 0;

    if(element >= SIID_LAST)
    {
        ASSERT("Invalid SHM info element %d\n", element);
        return 0;
    }

    /* verify that this thread holds the SHM lock. No race condition: if the
       current thread is here, it can't be in SHMLock or SHMUnlock */
    if( (HANDLE)pthread_self() != locking_thread )
    {
        ASSERT("SHMGetInfo called while thread does not hold the SHM lock!\n");
    }

    header = (SHM_FIRST_HEADER *)shm_segment_bases[0].Load();

    retval = header->shm_info[element];

    TRACE("SHM info element %d is %08x\n", element, retval );
    return retval;
}